

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int vm_builtin_func_exists(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_vm *pjVar1;
  jx9_value *pObj;
  undefined8 in_RAX;
  char *pKey;
  SyHashEntry_Pr *pSVar2;
  jx9_real jVar3;
  int nLen;
  sxu32 local_24;
  
  local_24 = (sxu32)((ulong)in_RAX >> 0x20);
  if (nArg < 1) {
LAB_0012ba75:
    jVar3 = 0.0;
  }
  else {
    pjVar1 = pCtx->pVm;
    pKey = jx9_value_to_string(*apArg,(int *)&local_24);
    if ((local_24 == 0) || ((pjVar1->hFunction).nEntry == 0)) {
LAB_0012ba41:
      jVar3 = 0.0;
      if ((local_24 == 0) || ((pjVar1->hHostFunction).nEntry == 0)) goto LAB_0012ba78;
      pSVar2 = HashGetEntry(&pjVar1->hHostFunction,pKey,local_24);
      if (pSVar2 == (SyHashEntry_Pr *)0x0) goto LAB_0012ba75;
    }
    else {
      pSVar2 = HashGetEntry(&pjVar1->hFunction,pKey,local_24);
      if (pSVar2 == (SyHashEntry_Pr *)0x0) goto LAB_0012ba41;
    }
    jVar3 = 4.94065645841247e-324;
  }
LAB_0012ba78:
  pObj = pCtx->pRet;
  jx9MemObjRelease(pObj);
  (pObj->x).rVal = jVar3;
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int vm_builtin_func_exists(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zName;
	jx9_vm *pVm;
	int nLen;
	int res;
	if( nArg < 1 ){
		/* Missing argument, return FALSE */
		jx9_result_bool(pCtx, 0);
		return SXRET_OK;
	}
	/* Point to the target VM */
	pVm = pCtx->pVm;
	/* Extract the function name */
	zName = jx9_value_to_string(apArg[0], &nLen);
	/* Assume the function is not defined */
	res = 0;
	/* Perform the lookup */
	if( SyHashGet(&pVm->hFunction, (const void *)zName, (sxu32)nLen) != 0 ||
		SyHashGet(&pVm->hHostFunction, (const void *)zName, (sxu32)nLen) != 0 ){
			/* Function is defined */
			res = 1;
	}
	jx9_result_bool(pCtx, res);
	return SXRET_OK;
}